

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t_const&>
          (SmallVectorBase<slang::logic_t> *this,logic_t *args)

{
  ulong uVar1;
  pointer p;
  pointer plVar2;
  pointer plVar3;
  pointer plVar4;
  size_type sVar5;
  pointer __src;
  long lVar6;
  ulong n;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    __src->value = args->value;
    sVar5 = this->len;
    this->len = sVar5 + 1;
    return this->data_ + sVar5;
  }
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  n = this->len + 1;
  uVar1 = this->cap;
  if (n < uVar1 * 2) {
    n = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    n = 0x7fffffffffffffff;
  }
  lVar6 = (long)__src - (long)this->data_;
  plVar2 = (pointer)operator_new(n);
  plVar2[lVar6].value = args->value;
  p = this->data_;
  sVar5 = this->len;
  plVar3 = p;
  plVar4 = plVar2;
  if (p + (sVar5 - (long)__src) == (pointer)0x0) {
    plVar3 = plVar2;
    plVar4 = p;
    if (sVar5 != 0) {
      do {
        plVar3->value = plVar4->value;
        plVar4 = plVar4 + 1;
        plVar3 = plVar3 + 1;
      } while (plVar4 != __src);
    }
  }
  else {
    for (; plVar3 != __src; plVar3 = plVar3 + 1) {
      plVar4->value = plVar3->value;
      plVar4 = plVar4 + 1;
    }
    memcpy(plVar2 + lVar6 + 1,__src,(size_t)(p + (sVar5 - (long)__src)));
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar5 = this->len;
  }
  this->len = sVar5 + 1;
  this->cap = n;
  this->data_ = plVar2;
  return plVar2 + lVar6;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }